

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

hash hash_callback_str(hash_key key)

{
  hash hVar1;
  ulong uVar2;
  char *str;
  char *pcVar3;
  
  uVar2 = (ulong)*key;
  pcVar3 = (char *)((long)key + 1);
  hVar1 = 0x1505;
  while ((char)uVar2 != '\0') {
    uVar2 = (ulong)*pcVar3;
    hVar1 = hVar1 * 0x21 + uVar2;
    pcVar3 = pcVar3 + 1;
  }
  return hVar1;
}

Assistant:

hash hash_callback_str(const hash_key key)
{
	/* djb2 */
	const char *str = (const char *)key;

	hash h = 0x1505;

	while (*str++ != '\0')
	{
		h = (hash)(((h << 5) + h) + *str);
	}

	return h;
}